

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::serverupdate(void)

{
  clientinfo *pcVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  server_entity *psVar6;
  ban *pbVar7;
  clientinfo **ppcVar8;
  multikillmsg *pmVar9;
  char *pcVar10;
  int local_54;
  char *pcStack_50;
  int i_4;
  char *msg;
  clientinfo *ci;
  int i_3;
  clientinfo *c;
  int i_2;
  int i_1;
  int local_10;
  uint local_c;
  int oldtime;
  int i;
  
  if (((shouldstep & 1) != 0) && ((gamepaused & 1) == 0)) {
    gamemillis = curtime + gamemillis;
    if ((gamemode < -3) || ((0x16 < gamemode || ((gamemodes[gamemode + 3].flags & 0x2000U) == 0))))
    {
      if ((gamemode < -3) ||
         (((0x16 < gamemode || ((gamemodes[gamemode + 3].flags & 0x7000U) != 0)) ||
          (gamemillis < gamelimit)))) {
        processevents();
        if (curtime != 0) {
          updateBanner();
          for (local_c = 0; uVar2 = local_c,
              iVar4 = vector<server::server_entity>::length((vector<server::server_entity> *)sents),
              (int)uVar2 < iVar4; local_c = local_c + 1) {
            psVar6 = vector<server::server_entity>::operator[]
                               ((vector<server::server_entity> *)sents,local_c);
            if (psVar6->spawntime != 0) {
              psVar6 = vector<server::server_entity>::operator[]
                                 ((vector<server::server_entity> *)sents,local_c);
              iVar4 = curtime;
              local_10 = psVar6->spawntime;
              psVar6 = vector<server::server_entity>::operator[]
                                 ((vector<server::server_entity> *)sents,local_c);
              psVar6->spawntime = psVar6->spawntime - iVar4;
              psVar6 = vector<server::server_entity>::operator[]
                                 ((vector<server::server_entity> *)sents,local_c);
              if (psVar6->spawntime < 1) {
                psVar6 = vector<server::server_entity>::operator[]
                                   ((vector<server::server_entity> *)sents,local_c);
                psVar6->spawntime = 0;
                psVar6 = vector<server::server_entity>::operator[]
                                   ((vector<server::server_entity> *)sents,local_c);
                psVar6->spawned = '\x01';
                sendf(-1,1,"ri2",0x19,(ulong)local_c);
              }
              else {
                psVar6 = vector<server::server_entity>::operator[]
                                   ((vector<server::server_entity> *)sents,local_c);
                if (((psVar6->spawntime < 0x2711) && (10000 < local_10)) &&
                   ((psVar6 = vector<server::server_entity>::operator[]
                                        ((vector<server::server_entity> *)sents,local_c),
                    psVar6->type == 0x12 ||
                    (psVar6 = vector<server::server_entity>::operator[]
                                        ((vector<server::server_entity> *)sents,local_c),
                    psVar6->type == 0xf)))) {
                  psVar6 = vector<server::server_entity>::operator[]
                                     ((vector<server::server_entity> *)sents,local_c);
                  sendf(-1,1,"ri2",0x46,(ulong)(uint)psVar6->type);
                }
              }
            }
          }
        }
        aiman::checkai();
        if (smode != (long *)0x0) {
          (**(code **)(*smode + 0x60))();
        }
      }
    }
    else {
      readdemo();
    }
  }
  while( true ) {
    iVar4 = vector<server::ban>::length((vector<server::ban> *)bannedips);
    bVar3 = false;
    if (iVar4 != 0) {
      pbVar7 = vector<server::ban>::operator[]((vector<server::ban> *)bannedips,0);
      bVar3 = pbVar7->expire - totalmillis < 1;
    }
    if (!bVar3) break;
    vector<server::ban>::remove((vector<server::ban> *)&i_2,bannedips);
    ban::~ban((ban *)&i_2);
  }
  for (c._4_4_ = 0;
      iVar5 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)connects),
      iVar4 = totalmillis, c._4_4_ < iVar5; c._4_4_ = c._4_4_ + 1) {
    ppcVar8 = vector<server::clientinfo_*>::operator[]
                        ((vector<server::clientinfo_*> *)connects,c._4_4_);
    if (15000 < iVar4 - (*ppcVar8)->connectmillis) {
      ppcVar8 = vector<server::clientinfo_*>::operator[]
                          ((vector<server::clientinfo_*> *)connects,c._4_4_);
      disconnect_client((*ppcVar8)->clientnum,8);
    }
  }
  if (((nextexceeded != 0) && (nextexceeded < gamemillis)) &&
     ((gamemode < -3 ||
      (((0x16 < gamemode || ((gamemodes[gamemode + 3].flags & 0x7000U) != 0)) ||
       (gamemillis < gamelimit)))))) {
    nextexceeded = 0;
    c._0_4_ = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients);
    while (c._0_4_ = (int)c + -1, -1 < (int)c) {
      ppcVar8 = vector<server::clientinfo_*>::operator[]
                          ((vector<server::clientinfo_*> *)clients,(int)c);
      pcVar1 = *ppcVar8;
      if ((pcVar1->state).super_fpsstate.aitype == 0) {
        bVar3 = clientinfo::checkexceeded(pcVar1);
        if (bVar3) {
          disconnect_client(pcVar1->clientnum,4);
        }
        else {
          clientinfo::scheduleexceeded(pcVar1);
        }
      }
    }
  }
  checkteamkills();
  if (((shouldstep & 1) != 0) && ((gamepaused & 1) == 0)) {
    if ((((-4 < gamemode) && ((gamemode < 0x17 && ((gamemodes[gamemode + 3].flags & 0x7000U) == 0)))
         ) && (smapname != '\0')) && (0 < gamemillis - curtime)) {
      checkintermission(false);
    }
    if ((0 < interm) && (interm < gamemillis)) {
      if (demorecord != 0) {
        enddemorecord();
      }
      interm = -1;
      checkvotes(true);
    }
  }
  ci._4_4_ = 0;
  do {
    iVar4 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients);
    if (iVar4 <= ci._4_4_) {
      iVar4 = vector<server::clientinfo_*>::length((vector<server::clientinfo_*> *)clients);
      shouldstep = 0 < iVar4;
      return;
    }
    ppcVar8 = vector<server::clientinfo_*>::operator[]
                        ((vector<server::clientinfo_*> *)clients,ci._4_4_);
    pcVar1 = *ppcVar8;
    if ((long)multifragmillis <= (long)totalmillis - (pcVar1->state).lastfragmillis) {
      if (minmultikill <= (pcVar1->state).multifrags) {
        pcStack_50 = (char *)0x0;
        for (local_54 = 0;
            iVar4 = vector<server::multikillmsg>::length
                              ((vector<server::multikillmsg> *)multikillmessages), local_54 < iVar4;
            local_54 = local_54 + 1) {
          pmVar9 = vector<server::multikillmsg>::operator[]
                             ((vector<server::multikillmsg> *)multikillmessages,local_54);
          if (pmVar9->frags == (pcVar1->state).multifrags) {
            pmVar9 = vector<server::multikillmsg>::operator[]
                               ((vector<server::multikillmsg> *)multikillmessages,local_54);
            pcStack_50 = pmVar9->msg;
            break;
          }
        }
        if (pcStack_50 == (char *)0x0) {
          pcVar10 = colorname(pcVar1);
          out(3,"\f2%s scored a \f6%s (%d)",pcVar10,defmultikillmsg,
              (ulong)(uint)(pcVar1->state).multifrags);
        }
        else {
          pcVar10 = colorname(pcVar1);
          out(3,"\f2%s scored a \f6%s",pcVar10,pcStack_50);
        }
      }
      (pcVar1->state).multifrags = 0;
    }
    ci._4_4_ = ci._4_4_ + 1;
  } while( true );
}

Assistant:

void serverupdate()
    {
        if(shouldstep && !gamepaused)
        {
            gamemillis += curtime;
            
            if(m_demo) readdemo();
            else if(!m_timed || gamemillis < gamelimit)
            {
                processevents();
                if(curtime)
                {
                    updateBanner();
                    loopv(sents) if(sents[i].spawntime) //spawn entities when timer reached
                    {
                        int oldtime = sents[i].spawntime;
                        sents[i].spawntime -= curtime;
                        if(sents[i].spawntime<=0)
                        {
                            sents[i].spawntime = 0;
                            sents[i].spawned = true;
                            sendf(-1, 1, "ri2", N_ITEMSPAWN, i);
                        }
                        else if(sents[i].spawntime<=10000 && oldtime>10000 && (sents[i].type==I_QUAD || sents[i].type==I_BOOST))
                        {
                            sendf(-1, 1, "ri2", N_ANNOUNCE, sents[i].type);
                        }
                    }
                }
                aiman::checkai();
                if(smode) smode->update();
            }
        }
        
        while(bannedips.length() && bannedips[0].expire-totalmillis <= 0) bannedips.remove(0);
        loopv(connects) if(totalmillis-connects[i]->connectmillis>15000) disconnect_client(connects[i]->clientnum, DISC_TIMEOUT);
        if(nextexceeded && gamemillis > nextexceeded && (!m_timed || gamemillis < gamelimit))
        {
            nextexceeded = 0;
            loopvrev(clients)
            {
                clientinfo &c = *clients[i];
                if(c.state.aitype != AI_NONE) continue;
                if(c.checkexceeded()) disconnect_client(c.clientnum, DISC_MSGERR);
                else c.scheduleexceeded();
            }
        }
        checkteamkills();
        
        if(shouldstep && !gamepaused)
        {
            if(m_timed && smapname[0] && gamemillis-curtime>0) checkintermission();
            if(interm > 0 && gamemillis>interm)
            {
                if(demorecord) enddemorecord();
                interm = -1;
                checkvotes(true);
            }
        }
       	//multi kill
        loopv(clients) {
            clientinfo *ci = clients[i];
            if(totalmillis - ci->state.lastfragmillis >= (int64_t)multifragmillis) {
                if(ci->state.multifrags >= minmultikill) {
                    char *msg = NULL;
                    loopv(multikillmessages) {
                        if(multikillmessages[i].frags == ci->state.multifrags) {
                            msg = multikillmessages[i].msg;
                            break;
                        }
                    }
                    if(msg) out(ECHO_SERV,"\f2%s scored a \f6%s", colorname(ci), msg);
                    else out(ECHO_SERV,"\f2%s scored a \f6%s (%d)", colorname(ci), defmultikillmsg, ci->state.multifrags);
                }
                ci->state.multifrags = 0;
            }
        }
        shouldstep = clients.length() > 0;
    }